

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThriftSenderTest.cpp
# Opt level: O3

void __thiscall
jaegertracing::anon_unknown_2::MockUDPSender::emitBatch(MockUDPSender *this,Batch *batch)

{
  ExceptionType EVar1;
  system_error *this_00;
  error_category *peVar2;
  undefined8 *puVar3;
  error_code __ec;
  
  EVar1 = this->_type;
  if (EVar1 == kString) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "error";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  if (EVar1 != kException) {
    if (EVar1 == kSystemError) {
      this_00 = (system_error *)__cxa_allocate_exception(0x20);
      peVar2 = (error_category *)std::_V2::generic_category();
      __ec._M_cat = peVar2;
      __ec._0_8_ = 0x16;
      std::system_error::system_error(this_00,__ec);
      __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
    }
    __assert_fail("_type == ExceptionType::kString",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ThriftSenderTest.cpp"
                  ,0x31,
                  "virtual void jaegertracing::(anonymous namespace)::MockUDPSender::emitBatch(const thrift::Batch &)"
                 );
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = std::__cxx11::string::operator=;
  __cxa_throw(puVar3,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

void emitBatch(const thrift::Batch& batch) override
    {
        switch (_type) {
        case ExceptionType::kSystemError:
            throw std::system_error(
                std::make_error_code(std::errc::invalid_argument));
        case ExceptionType::kException:
            throw std::exception();
        default:
            assert(_type == ExceptionType::kString);
            throw "error";
        }
    }